

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner_product_impl.h
# Opt level: O3

int secp256k1_bulletproof_inner_product_real_prove_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,secp256k1_ge *out_pt,
              size_t *pt_idx,secp256k1_ge *g,secp256k1_ge *geng,secp256k1_ge *genh,
              secp256k1_scalar *a_arr,secp256k1_scalar *b_arr,secp256k1_scalar *yinv,
              secp256k1_scalar *ux,size_t n,uchar *commit)

{
  size_t n_00;
  size_t sVar1;
  bool bVar2;
  secp256k1_scalar *psVar3;
  undefined4 extraout_EAX;
  int iVar4;
  ulong uVar5;
  ulong n_01;
  secp256k1_scalar *psVar6;
  secp256k1_scalar *r;
  long lVar7;
  secp256k1_ge *r_00;
  secp256k1_scalar *psVar8;
  secp256k1_scalar *psVar9;
  secp256k1_ge *r_01;
  secp256k1_scalar *r_02;
  ulong n_02;
  secp256k1_scalar *r_03;
  undefined1 auVar11 [16];
  int overflow;
  secp256k1_ge *local_a30;
  secp256k1_ge *local_a28;
  secp256k1_scalar *local_a20;
  secp256k1_scalar *local_a18;
  secp256k1_scalar *local_a10;
  secp256k1_scalar prod;
  secp256k1_gej tmplj;
  secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
  secp256k1_gej tmprj;
  size_t sVar10;
  
  pfdata.yinv.d[0] = yinv->d[0];
  pfdata.yinv.d[1] = yinv->d[1];
  pfdata.yinv.d[2] = yinv->d[2];
  pfdata.yinv.d[3] = yinv->d[3];
  pfdata.genh = genh;
  pfdata.a = a_arr;
  pfdata.b = b_arr;
  pfdata.n = n;
  if (3 < n) {
    n_00 = n + 1;
    local_a18 = b_arr + 1;
    local_a20 = a_arr + 1;
    lVar7 = 0;
    sVar10 = n;
    local_a30 = geng;
    local_a28 = g;
    pfdata.geng = geng;
    pfdata.g = g;
    do {
      psVar8 = &pfdata.g_sc;
      n_02 = sVar10 >> 1;
      pfdata.grouping = (size_t)(uint)(1 << ((byte)lVar7 & 0x1f));
      pfdata.g_sc.d[2] = 0;
      pfdata.g_sc.d[3] = 0;
      pfdata.g_sc.d[0] = 0;
      pfdata.g_sc.d[1] = 0;
      if (sVar10 < 2) {
        secp256k1_scalar_mul(psVar8,psVar8,ux);
        pfdata.yinvn.d[0] = 1;
        pfdata.yinvn.d[1] = 0;
        pfdata.yinvn.d[2] = 0;
        pfdata.yinvn.d[3] = 0;
        secp256k1_ecmult_multi_var
                  (ecmult_ctx,scratch,&tmplj,(secp256k1_scalar *)0x0,
                   secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l,&pfdata,n_00);
        sVar1 = *pt_idx;
        *pt_idx = sVar1 + 1;
        secp256k1_ge_set_gej(out_pt + sVar1,&tmplj);
        pfdata.g_sc.d[2] = 0;
        pfdata.g_sc.d[3] = 0;
        pfdata.g_sc.d[0] = 0;
        pfdata.g_sc.d[1] = 0;
      }
      else {
        psVar6 = a_arr;
        psVar9 = local_a18;
        uVar5 = n_02;
        do {
          secp256k1_scalar_mul(&prod,psVar6,psVar9);
          secp256k1_scalar_add(psVar8,psVar8,&prod);
          psVar9 = psVar9 + 2;
          psVar6 = psVar6 + 2;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        secp256k1_scalar_mul(psVar8,psVar8,ux);
        pfdata.yinvn.d[0] = 1;
        pfdata.yinvn.d[1] = 0;
        pfdata.yinvn.d[2] = 0;
        pfdata.yinvn.d[3] = 0;
        secp256k1_ecmult_multi_var
                  (ecmult_ctx,scratch,&tmplj,(secp256k1_scalar *)0x0,
                   secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l,&pfdata,n_00);
        sVar1 = *pt_idx;
        *pt_idx = sVar1 + 1;
        secp256k1_ge_set_gej(out_pt + sVar1,&tmplj);
        pfdata.g_sc.d[2] = 0;
        pfdata.g_sc.d[3] = 0;
        pfdata.g_sc.d[0] = 0;
        pfdata.g_sc.d[1] = 0;
        psVar6 = b_arr;
        psVar9 = local_a20;
        uVar5 = n_02;
        if (1 < sVar10) {
          do {
            secp256k1_scalar_mul(&prod,psVar9,psVar6);
            secp256k1_scalar_add(psVar8,psVar8,&prod);
            uVar5 = uVar5 - 1;
            psVar6 = psVar6 + 2;
            psVar9 = psVar9 + 2;
          } while (uVar5 != 0);
        }
      }
      secp256k1_scalar_mul(psVar8,psVar8,ux);
      pfdata.yinvn.d[0] = 1;
      pfdata.yinvn.d[1] = 0;
      pfdata.yinvn.d[2] = 0;
      pfdata.yinvn.d[3] = 0;
      secp256k1_ecmult_multi_var
                (ecmult_ctx,scratch,&tmprj,(secp256k1_scalar *)0x0,
                 secp256k1_bulletproof_innerproduct_pf_ecmult_callback_r,&pfdata,n_00);
      sVar1 = *pt_idx;
      *pt_idx = sVar1 + 1;
      secp256k1_ge_set_gej(out_pt + sVar1,&tmprj);
      secp256k1_bulletproof_update_commit(commit,out_pt + (*pt_idx - 2),out_pt + (*pt_idx - 1));
      psVar8 = pfdata.x + lVar7;
      secp256k1_scalar_set_b32(psVar8,commit,&overflow);
      if (overflow != 0) {
        return 0;
      }
      auVar11._0_4_ = -(uint)((int)pfdata.x[lVar7].d[2] == 0 && (int)psVar8->d[0] == 0);
      auVar11._4_4_ =
           -(uint)(*(int *)((long)pfdata.x[lVar7].d + 0x14) == 0 &&
                  *(int *)((long)pfdata.x[lVar7].d + 4) == 0);
      auVar11._8_4_ = -(uint)((int)pfdata.x[lVar7].d[3] == 0 && (int)pfdata.x[lVar7].d[1] == 0);
      auVar11._12_4_ =
           -(uint)(*(int *)((long)pfdata.x[lVar7].d + 0x1c) == 0 &&
                  *(int *)((long)pfdata.x[lVar7].d + 0xc) == 0);
      iVar4 = movmskps(extraout_EAX,auVar11);
      if (iVar4 == 0xf) {
        return 0;
      }
      r = pfdata.xinv + lVar7;
      secp256k1_scalar_inverse(r,psVar8);
      uVar5 = n_02;
      psVar6 = a_arr;
      psVar9 = a_arr;
      r_02 = b_arr;
      r_03 = b_arr;
      psVar3 = psVar8;
      if (1 < sVar10) {
        do {
          local_a10 = psVar3;
          secp256k1_scalar_mul(psVar6,psVar6,psVar8);
          secp256k1_scalar_mul(&prod,psVar6 + 1,r);
          secp256k1_scalar_add(psVar9,psVar6,&prod);
          psVar8 = local_a10;
          secp256k1_scalar_mul(r_03,r_03,r);
          secp256k1_scalar_mul(&prod,r_03 + 1,psVar8);
          secp256k1_scalar_add(r_02,r_03,&prod);
          uVar5 = uVar5 - 1;
          psVar6 = psVar6 + 2;
          psVar9 = psVar9 + 1;
          r_02 = r_02 + 1;
          r_03 = r_03 + 2;
          psVar3 = local_a10;
        } while (uVar5 != 0);
      }
      if (((0x800 < n && lVar7 == 3) || (0x80 < n && lVar7 == 2)) || (0x20 < n && lVar7 == 1)) {
        if (sVar10 < 2) {
          secp256k1_scalar_sqr(&prod,yinv);
          goto LAB_0011d369;
        }
        n_01 = (ulong)(uint)(2 << ((byte)lVar7 & 0x1f));
        uVar5 = sVar10 >> 1;
        r_00 = genh;
        r_01 = local_a30;
        do {
          secp256k1_ecmult_multi_var
                    (ecmult_ctx,scratch,(secp256k1_gej *)&prod,(secp256k1_scalar *)0x0,
                     secp256k1_bulletproof_innerproduct_pf_ecmult_callback_g,&pfdata,n_01);
          pfdata.geng = pfdata.geng + n_01;
          secp256k1_ge_set_gej(r_01,(secp256k1_gej *)&prod);
          pfdata.yinvn.d[0] = 1;
          pfdata.yinvn.d[1] = 0;
          pfdata.yinvn.d[2] = 0;
          pfdata.yinvn.d[3] = 0;
          secp256k1_ecmult_multi_var
                    (ecmult_ctx,scratch,(secp256k1_gej *)&prod,(secp256k1_scalar *)0x0,
                     secp256k1_bulletproof_innerproduct_pf_ecmult_callback_h,&pfdata,n_01);
          pfdata.genh = pfdata.genh + n_01;
          secp256k1_ge_set_gej(r_00,(secp256k1_gej *)&prod);
          r_00 = r_00 + 1;
          r_01 = r_01 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        secp256k1_scalar_sqr(&prod,yinv);
        if (lVar7 != 0) {
LAB_0011d369:
          do {
            secp256k1_scalar_sqr(&prod,&prod);
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        iVar4 = secp256k1_bulletproof_inner_product_real_prove_impl
                          (ecmult_ctx,scratch,out_pt,pt_idx,local_a28,local_a30,genh,a_arr,b_arr,
                           &prod,ux,n_02,commit);
        if (iVar4 == 0) {
          return 0;
        }
        return 1;
      }
      lVar7 = lVar7 + 1;
      bVar2 = 7 < sVar10;
      sVar10 = n_02;
    } while (bVar2);
  }
  return 1;
}

Assistant:

static int secp256k1_bulletproof_inner_product_real_prove_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, secp256k1_ge *out_pt, size_t *pt_idx, const secp256k1_ge *g, secp256k1_ge *geng, secp256k1_ge *genh, secp256k1_scalar *a_arr, secp256k1_scalar *b_arr, const secp256k1_scalar *yinv, const secp256k1_scalar *ux, const size_t n, unsigned char *commit) {
    size_t i;
    size_t halfwidth;

    secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
    pfdata.yinv = *yinv;
    pfdata.g = g;
    pfdata.geng = geng;
    pfdata.genh = genh;
    pfdata.a = a_arr;
    pfdata.b = b_arr;
    pfdata.n = n;

    /* Protocol 1: Iterate, halving vector size until it is 1 */
    for (halfwidth = n / 2, i = 0; halfwidth > IP_AB_SCALARS / 4; halfwidth /= 2, i++) {
        secp256k1_gej tmplj, tmprj;
        size_t j;
        int overflow;

        pfdata.grouping = 1u << i;

        /* L */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j], &b_arr[2*j + 1]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmplj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmplj);

        /* R */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j + 1], &b_arr[2*j]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmprj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_r, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmprj);

        /* x, x^2, x^-1, x^-2 */
        secp256k1_bulletproof_update_commit(commit, &out_pt[*pt_idx - 2], &out_pt[*pt_idx] - 1);
        secp256k1_scalar_set_b32(&pfdata.x[i], commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&pfdata.x[i])) {
            return 0;
        }
        secp256k1_scalar_inverse_var(&pfdata.xinv[i], &pfdata.x[i]);

        /* update scalar array */
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar tmps;
            secp256k1_scalar_mul(&a_arr[2*j], &a_arr[2*j], &pfdata.x[i]);
            secp256k1_scalar_mul(&tmps, &a_arr[2*j + 1], &pfdata.xinv[i]);
            secp256k1_scalar_add(&a_arr[j], &a_arr[2*j], &tmps);

            secp256k1_scalar_mul(&b_arr[2*j], &b_arr[2*j], &pfdata.xinv[i]);
            secp256k1_scalar_mul(&tmps, &b_arr[2*j + 1], &pfdata.x[i]);
            secp256k1_scalar_add(&b_arr[j], &b_arr[2*j], &tmps);

        }

        /* Combine G generators and recurse, if that would be more optimal */
        if ((n > 2048 && i == 3) || (n > 128 && i == 2) || (n > 32 && i == 1)) {
            secp256k1_scalar yinv2;

            for (j = 0; j < halfwidth; j++) {
                secp256k1_gej rj;
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_g, (void *) &pfdata, 2u << i);
                pfdata.geng += 2u << i;
                secp256k1_ge_set_gej(&geng[j], &rj);
                secp256k1_scalar_set_int(&pfdata.yinvn, 1);
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_h, (void *) &pfdata, 2u << i);
                pfdata.genh += 2u << i;
                secp256k1_ge_set_gej(&genh[j], &rj);
            }

            secp256k1_scalar_sqr(&yinv2, yinv);
            for (j = 0; j < i; j++) {
                secp256k1_scalar_sqr(&yinv2, &yinv2);
            }
            if (!secp256k1_bulletproof_inner_product_real_prove_impl(ecmult_ctx, scratch, out_pt, pt_idx, g, geng, genh, a_arr, b_arr, &yinv2, ux, halfwidth, commit)) {
                return 0;
            }
            break;
        }
    }
    return 1;
}